

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

int stbir_set_pixel_subrect(STBIR_RESIZE *resize,int subx,int suby,int subw,int subh)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = (double)resize->output_w;
  dVar3 = (double)resize->output_h;
  resize->input_s0 = (double)subx / dVar2;
  resize->input_t0 = (double)suby / dVar3;
  resize->input_s1 = (double)(subw + subx) / dVar2;
  resize->input_t1 = (double)(subh + suby) / dVar3;
  resize->output_subx = subx;
  resize->output_suby = suby;
  resize->output_subw = subw;
  resize->output_subh = subh;
  resize->needs_rebuild = 1;
  uVar1 = 0;
  if (suby < resize->output_h && (0 < subw + subx && subx < resize->output_w)) {
    uVar1 = (uint)((subh != 0 && subw != 0) && 0 < subh + suby);
  }
  return uVar1;
}

Assistant:

STBIRDEF int stbir_set_pixel_subrect( STBIR_RESIZE * resize, int subx, int suby, int subw, int subh )                 // sets both regions (full regions by default)
{
  double s0, t0, s1, t1;

  s0 = ( (double)subx ) / ( (double)resize->output_w );
  t0 = ( (double)suby ) / ( (double)resize->output_h );
  s1 = ( (double)(subx+subw) ) / ( (double)resize->output_w );
  t1 = ( (double)(suby+subh) ) / ( (double)resize->output_h );

  resize->input_s0 = s0;
  resize->input_t0 = t0;
  resize->input_s1 = s1;
  resize->input_t1 = t1;
  resize->output_subx = subx;
  resize->output_suby = suby;
  resize->output_subw = subw;
  resize->output_subh = subh;
  resize->needs_rebuild = 1;

  // are we inbounds?
  if ( ( subx >= resize->output_w ) || ( ( subx + subw ) <= 0 ) || ( suby >= resize->output_h ) || ( ( suby + subh ) <= 0 ) || ( subw == 0 ) || ( subh == 0 ) )
    return 0;

  return 1;
}